

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O0

CompoundString *
Js::CompoundString::NewWithCharCapacity(CharCount initialCharCapacity,JavascriptLibrary *library)

{
  bool bVar1;
  CharCount charCapacity;
  uint initialBlockSize;
  CharCount alignedInitialCharCapacity;
  JavascriptLibrary *library_local;
  CompoundString *pCStack_10;
  CharCount initialCharCapacity_local;
  
  charCapacity = BlockInfo::AlignCharCapacityForAllocation(initialCharCapacity);
  bVar1 = BlockInfo::ShouldAllocateBuffer(charCapacity);
  if (bVar1) {
    pCStack_10 = NewWithBufferCharCapacity(charCapacity,library);
  }
  else {
    initialBlockSize = Block::SizeFromUsedCharLength(initialCharCapacity);
    pCStack_10 = NewWithBlockSize(initialBlockSize,library);
  }
  return pCStack_10;
}

Assistant:

CompoundString *CompoundString::NewWithCharCapacity(
        const CharCount initialCharCapacity,
        JavascriptLibrary *const library)
    {
        const CharCount alignedInitialCharCapacity = BlockInfo::AlignCharCapacityForAllocation(initialCharCapacity);
        if(BlockInfo::ShouldAllocateBuffer(alignedInitialCharCapacity))
            return NewWithBufferCharCapacity(alignedInitialCharCapacity, library);
        return NewWithBlockSize(Block::SizeFromUsedCharLength(initialCharCapacity), library);
    }